

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void free_allocated_blocks(ListNode *check_point)

{
  ListNode *result;
  long in_RDI;
  MallocBlockInfo block_info;
  ListNode *node;
  ListNode *head;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  ListNode *expression;
  
  result = get_allocated_blocks_list();
  _assert_true((unsigned_long)result,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffdc);
  expression = *(ListNode **)(in_RDI + 0x10);
  _assert_true((unsigned_long)result,(char *)expression,in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffdc);
  while (expression != result) {
    expression = expression->next;
    _test_free(head,(char *)node,block_info._4_4_);
  }
  return;
}

Assistant:

static void free_allocated_blocks(const ListNode * const check_point) {
    const ListNode * const head = get_allocated_blocks_list();
    const ListNode *node;
    assert_non_null(check_point);

    node = check_point->next;
    assert_non_null(node);

    while (node != head) {
        const MallocBlockInfo block_info = {
            .ptr = discard_const(node->value),
        };
        node = node->next;
        free(discard_const_p(char, block_info.data) +
             sizeof(struct MallocBlockInfoData) +
             MALLOC_GUARD_SIZE);
    }
}